

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O3

Request<capnp::AnyPointer,_capnp::AnyPointer> * __thiscall
capnp::QueuedClient::newCall
          (Request<capnp::AnyPointer,_capnp::AnyPointer> *__return_storage_ptr__,QueuedClient *this,
          uint64_t interfaceId,uint16_t methodId,Maybe<capnp::MessageSize> *sizeHint)

{
  uint *puVar1;
  CapTableBuilder *pCVar2;
  Own<capnp::LocalRequest> OVar3;
  Builder root;
  uint16_t local_42;
  Builder local_40;
  Disposer *local_28;
  RequestHook *pRStack_20;
  uint64_t local_10;
  
  puVar1 = &(this->super_Refcounted).refcount;
  *puVar1 = *puVar1 + 1;
  local_40.builder.segment = (SegmentBuilder *)&this->super_Refcounted;
  local_42 = methodId;
  local_40.builder.capTable = (CapTableBuilder *)this;
  local_10 = interfaceId;
  OVar3 = kj::
          heap<capnp::LocalRequest,unsigned_long&,unsigned_short&,kj::Maybe<capnp::MessageSize>&,kj::Own<capnp::QueuedClient>>
                    ((kj *)&local_28,&local_10,&local_42,sizeHint,
                     (Own<capnp::QueuedClient> *)&local_40);
  pCVar2 = local_40.builder.capTable;
  if ((QueuedClient *)local_40.builder.capTable != (QueuedClient *)0x0) {
    local_40.builder.capTable = (CapTableBuilder *)0x0;
    (*(code *)(((local_40.builder.segment)->super_SegmentReader).arena)->_vptr_Arena)
              (local_40.builder.segment,
               ((ClientHook *)&pCVar2->super_CapTableReader)->_vptr_ClientHook[-2] +
               (long)&((ClientHook *)&pCVar2->super_CapTableReader)->_vptr_ClientHook,OVar3.ptr);
  }
  MessageBuilder::getRootInternal(&local_40,(MessageBuilder *)pRStack_20[2]._vptr_RequestHook);
  (__return_storage_ptr__->super_Builder).builder.pointer = local_40.builder.pointer;
  (__return_storage_ptr__->super_Builder).builder.segment = local_40.builder.segment;
  (__return_storage_ptr__->super_Builder).builder.capTable = local_40.builder.capTable;
  (__return_storage_ptr__->hook).disposer = local_28;
  (__return_storage_ptr__->hook).ptr = pRStack_20;
  return __return_storage_ptr__;
}

Assistant:

Request<AnyPointer, AnyPointer> newCall(
      uint64_t interfaceId, uint16_t methodId, kj::Maybe<MessageSize> sizeHint) override {
    auto hook = kj::heap<LocalRequest>(
        interfaceId, methodId, sizeHint, kj::addRef(*this));
    auto root = hook->message->getRoot<AnyPointer>();
    return Request<AnyPointer, AnyPointer>(root, kj::mv(hook));
  }